

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

int AF_A_Raise(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  player_t *this;
  PClass *pPVar4;
  int iVar5;
  undefined8 uVar6;
  PClass *pPVar7;
  DPSprite *this_00;
  undefined4 extraout_var;
  undefined4 in_register_00000014;
  VMValue *pVVar8;
  char *__assertion;
  bool bVar9;
  double dVar10;
  undefined1 auVar11 [16];
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  uVar6 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0052ef0e;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    puVar2 = (undefined8 *)(param->field_0).field_1.a;
    pVVar8 = param;
    if (puVar2 != (undefined8 *)0x0) {
      if (puVar2[1] == 0) {
        auVar11 = (**(code **)*puVar2)(puVar2);
        uVar6 = auVar11._8_8_;
        puVar2[1] = auVar11._0_8_;
      }
      pPVar7 = (PClass *)puVar2[1];
      bVar9 = pPVar7 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar9;
      uVar6 = CONCAT71((int7)((ulong)uVar6 >> 8),bVar9);
      pVVar8 = (VMValue *)(ulong)(pPVar7 == pPVar4 || bVar9);
      if (pPVar7 != pPVar4 && !bVar9) {
        do {
          pPVar7 = pPVar7->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
          if (pPVar7 == pPVar4) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0052ef0e;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_0052eee3;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar6 = (**(code **)*puVar3)(puVar3,pVVar8,uVar6,ret);
          puVar3[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar3[1];
        bVar9 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar4 && bVar9) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar9 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar4) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0052ef0e;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      if ((puVar2 != (undefined8 *)0x0) &&
         (this = (player_t *)puVar2[0x40], this != (player_t *)0x0)) {
        if (this->PendingWeapon == (AWeapon *)0xffffffffffffffff) {
          if (this->ReadyWeapon != (AWeapon *)0x0) {
            this_00 = player_t::GetPSprite(this,PSP_WEAPON);
            dVar10 = this_00->y + -6.0;
            this_00->y = dVar10;
            if (dVar10 <= 32.375) {
              this_00->y = 32.375;
              iVar5 = (*(this->ReadyWeapon->super_AInventory).super_AActor.super_DThinker.
                        super_DObject._vptr_DObject[0x46])();
              DPSprite::SetState(this_00,(FState *)CONCAT44(extraout_var,iVar5),false);
            }
          }
        }
        else {
          P_DropWeapon(this);
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_0052eee3:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0052ef0e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x452,"int AF_A_Raise(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AInventory, A_Raise)
{
	PARAM_ACTION_PROLOGUE;

	if (self == nullptr)
	{
		return 0;
	}
	player_t *player = self->player;
	DPSprite *psp;

	if (nullptr == player)
	{
		return 0;
	}
	if (player->PendingWeapon != WP_NOCHANGE)
	{
		P_DropWeapon(player);
		return 0;
	}
	if (player->ReadyWeapon == nullptr)
	{
		return 0;
	}
	psp = player->GetPSprite(PSP_WEAPON);
	psp->y -= RAISESPEED;
	if (psp->y > WEAPONTOP)
	{ // Not raised all the way yet
		return 0;
	}
	psp->y = WEAPONTOP;
	psp->SetState(player->ReadyWeapon->GetReadyState());
	return 0;
}